

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall
HEkk::isBadBasisChange
          (HEkk *this,SimplexAlgorithm algorithm,HighsInt variable_in,HighsInt row_out,
          HighsInt rebuild_reason)

{
  uint uVar1;
  uint *puVar2;
  ValueType *pVVar3;
  size_type sVar4;
  reference pvVar5;
  int in_ECX;
  uint in_EDX;
  HighsInt in_ESI;
  u64 *in_RDI;
  int in_R8D;
  BadBasisChangeReason unaff_retaddr;
  HighsInt unaff_retaddr_00;
  HighsInt in_stack_00000008;
  HighsInt in_stack_0000000c;
  HEkk *in_stack_00000010;
  HighsInt iX;
  bool posible_cycling;
  bool cycling_detected;
  HighsInt variable_out;
  uint64_t currhash;
  int local_34;
  bool local_2d;
  u64 *hash;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  if (in_R8D == 0) {
    if ((in_EDX == 0xffffffff) || (in_ECX == -1)) {
      bVar6 = false;
    }
    else {
      hash = in_RDI;
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52f),(long)in_ECX
                                 );
      uVar1 = *puVar2;
      HighsHashHelpers::sparse_inverse_combine(hash,in_ESI);
      HighsHashHelpers::sparse_combine(hash,in_ESI);
      local_2d = false;
      pVVar3 = HighsHashTable<unsigned_long,_void>::find
                         ((HighsHashTable<unsigned_long,_void> *)CONCAT44(in_ESI,in_EDX),
                          (KeyType *)CONCAT44(in_ECX,in_R8D));
      if (pVVar3 != (ValueType *)0x0) {
        local_2d = (int)in_RDI[0x6df] != *(int *)((long)in_RDI + 0x3704) + 1;
        if (local_2d) {
          *(int *)((long)in_RDI + 0x3704) = (int)in_RDI[0x6df];
        }
        local_2d = !local_2d;
      }
      if (local_2d) {
        if (in_ESI == 2) {
          *(int *)((long)in_RDI + 0x86c) = *(int *)((long)in_RDI + 0x86c) + 1;
        }
        else {
          *(int *)(in_RDI + 0x10d) = (int)in_RDI[0x10d] + 1;
        }
        highsLogDev((HighsLogOptions *)(in_RDI[1] + 0x380),kWarning,
                    " basis change (%d out; %d in) is bad\n",(ulong)uVar1,(ulong)in_EDX);
        addBadBasisChange(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                          unaff_retaddr,(bool)in_stack_ffffffffffffffff);
        bVar6 = true;
      }
      else {
        for (local_34 = 0;
            sVar4 = std::
                    vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                    ::size((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                            *)(in_RDI + 0x710)), local_34 < (int)sVar4; local_34 = local_34 + 1) {
          pvVar5 = std::
                   vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                   ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                 *)(in_RDI + 0x710),(long)local_34);
          if (((pvVar5->variable_out == uVar1) &&
              (pvVar5 = std::
                        vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                        ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                      *)(in_RDI + 0x710),(long)local_34),
              pvVar5->variable_in == in_EDX)) &&
             (pvVar5 = std::
                       vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                       ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                     *)(in_RDI + 0x710),(long)local_34), pvVar5->row_out == in_ECX))
          {
            pvVar5 = std::
                     vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                     ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                   *)(in_RDI + 0x710),(long)local_34);
            pvVar5->taboo = true;
            return true;
          }
        }
        bVar6 = false;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool HEkk::isBadBasisChange(const SimplexAlgorithm algorithm,
                            const HighsInt variable_in, const HighsInt row_out,
                            const HighsInt rebuild_reason) {
  if (rebuild_reason) return false;
  if (variable_in == -1 || row_out == -1) return false;
  uint64_t currhash = basis_.hash;
  HighsInt variable_out = basis_.basicIndex_[row_out];

  HighsHashHelpers::sparse_inverse_combine(currhash, variable_out);
  HighsHashHelpers::sparse_combine(currhash, variable_in);

  bool cycling_detected = false;
  const bool posible_cycling = visited_basis_.find(currhash) != nullptr;
  if (posible_cycling) {
    if (iteration_count_ == previous_iteration_cycling_detected + 1) {
      // Cycling detected on successive iterations suggests infinite cycling
      //      highsLogDev(options_->log_options, HighsLogType::kWarning,
      //		  "Cycling detected in %s simplex:");
      // printf("Cycling detected in %s simplex solve %d (Iteration %d)",
      //        algorithm == SimplexAlgorithm::kPrimal ? "primal" : "dual",
      //        (int)debug_solve_call_num_, (int)iteration_count_);
      cycling_detected = true;
    } else {
      previous_iteration_cycling_detected = iteration_count_;
    }
  }
  if (cycling_detected) {
    if (algorithm == SimplexAlgorithm::kDual) {
      analysis_.num_dual_cycling_detections++;
    } else {
      analysis_.num_primal_cycling_detections++;
    }
    highsLogDev(options_->log_options, HighsLogType::kWarning,
                " basis change (%d out; %d in) is bad\n", (int)variable_out,
                (int)variable_in);
    addBadBasisChange(row_out, variable_out, variable_in,
                      BadBasisChangeReason::kCycling, true);
    return true;
  } else {
    // Look to see whether this basis change is in the list of bad
    // ones
    for (HighsInt iX = 0; iX < (HighsInt)bad_basis_change_.size(); iX++) {
      if (bad_basis_change_[iX].variable_out == variable_out &&
          bad_basis_change_[iX].variable_in == variable_in &&
          bad_basis_change_[iX].row_out == row_out) {
        bad_basis_change_[iX].taboo = true;
        return true;
      }
    }
  }

  return false;
}